

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult access_tda(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  _Bool _Var1;
  int iVar2;
  uint64_t uVar3;
  bool bVar4;
  _Bool mdcr_el2_tda;
  int el;
  _Bool isread_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  bVar4 = true;
  if ((((env->cp15).mdcr_el2 & 0x200) == 0) && (bVar4 = true, ((env->cp15).mdcr_el2 & 0x100) == 0))
  {
    uVar3 = arm_hcr_el2_eff_aarch64(env);
    bVar4 = (uVar3 & 0x8000000) != 0;
  }
  if (((iVar2 < 2) && (bVar4)) && (_Var1 = arm_is_secure_below_el3(env), !_Var1)) {
    return CP_ACCESS_TRAP_EL2;
  }
  if ((iVar2 < 3) && (((env->cp15).mdcr_el3 & 0x200) != 0)) {
    env_local._4_4_ = CP_ACCESS_TRAP_EL3;
  }
  else {
    env_local._4_4_ = CP_ACCESS_OK;
  }
  return env_local._4_4_;
}

Assistant:

static CPAccessResult access_tda(CPUARMState *env, const ARMCPRegInfo *ri,
                                  bool isread)
{
    int el = arm_current_el(env);
    bool mdcr_el2_tda = (env->cp15.mdcr_el2 & MDCR_TDA) ||
        (env->cp15.mdcr_el2 & MDCR_TDE) ||
        (arm_hcr_el2_eff(env) & HCR_TGE);

    if (el < 2 && mdcr_el2_tda && !arm_is_secure_below_el3(env)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 && (env->cp15.mdcr_el3 & MDCR_TDA)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}